

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_stroke_rect(nk_command_buffer *b,nk_rect rect,float rounding,float line_thickness,nk_color c
                   )

{
  float fVar1;
  void *pvVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar5 = rect.w;
  fVar6 = rect.h;
  fVar3 = rect.x;
  fVar4 = rect.y;
  if (b != (nk_command_buffer *)0x0) {
    if ((((0.0 < line_thickness) && (0xffffff < (uint)c)) && ((fVar5 != 0.0 || (NAN(fVar5))))) &&
       (((fVar6 != 0.0 || (NAN(fVar6))) &&
        ((b->use_clipping == 0 ||
         ((((fVar1 = (b->clip).x, fVar1 <= fVar3 + fVar5 && (fVar3 <= fVar1 + (b->clip).w)) &&
           (fVar1 = (b->clip).y, fVar1 <= fVar4 + fVar6)) && (fVar4 <= fVar1 + (b->clip).h)))))))) {
      pvVar2 = nk_command_buffer_push(b,NK_COMMAND_RECT,0x20);
      if (pvVar2 != (void *)0x0) {
        *(short *)((long)pvVar2 + 0x10) = (short)(int)rounding;
        *(short *)((long)pvVar2 + 0x12) = (short)(int)line_thickness;
        *(short *)((long)pvVar2 + 0x14) = (short)(int)fVar3;
        *(short *)((long)pvVar2 + 0x16) = (short)(int)fVar4;
        if (fVar5 <= 0.0) {
          fVar5 = 0.0;
        }
        *(short *)((long)pvVar2 + 0x18) = (short)(int)fVar5;
        if (fVar6 <= 0.0) {
          fVar6 = 0.0;
        }
        *(short *)((long)pvVar2 + 0x1a) = (short)(int)fVar6;
        *(short *)((long)pvVar2 + 0x1c) = c._0_2_;
        *(nk_byte *)((long)pvVar2 + 0x1e) = c.b;
        *(nk_byte *)((long)pvVar2 + 0x1f) = c.a;
      }
    }
    return;
  }
  __assert_fail("b",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x2246,
                "void nk_stroke_rect(struct nk_command_buffer *, struct nk_rect, float, float, struct nk_color)"
               );
}

Assistant:

NK_API void
nk_stroke_rect(struct nk_command_buffer *b, struct nk_rect rect,
    float rounding, float line_thickness, struct nk_color c)
{
    struct nk_command_rect *cmd;
    NK_ASSERT(b);
    if (!b || c.a == 0 || rect.w == 0 || rect.h == 0 || line_thickness <= 0) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INTERSECT(rect.x, rect.y, rect.w, rect.h,
            clip->x, clip->y, clip->w, clip->h)) return;
    }
    cmd = (struct nk_command_rect*)
        nk_command_buffer_push(b, NK_COMMAND_RECT, sizeof(*cmd));
    if (!cmd) return;
    cmd->rounding = (unsigned short)rounding;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->x = (short)rect.x;
    cmd->y = (short)rect.y;
    cmd->w = (unsigned short)NK_MAX(0, rect.w);
    cmd->h = (unsigned short)NK_MAX(0, rect.h);
    cmd->color = c;
}